

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O0

void __thiscall TPZStream::Read(TPZStream *this,Fad<long_double> *p,int howMany)

{
  undefined1 auVar1 [16];
  double dVar2;
  ulong uVar3;
  Fad<double> *this_00;
  uint in_EDX;
  long *in_RDI;
  ulong uVar4;
  uint i;
  Fad<double> *copy;
  Fad<long_double> *in_stack_ffffffffffffff18;
  Vector<double> *pVVar5;
  Fad<long_double> *in_stack_ffffffffffffff20;
  Fad<double> *in_stack_ffffffffffffff30;
  Fad<double> *in_stack_ffffffffffffff38;
  Vector<double> *pVVar6;
  Fad<long_double> *in_stack_ffffffffffffff40;
  Vector<double> *local_98;
  uint local_30;
  
  dVar2 = (double)(long)(int)in_EDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = dVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar4 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  this_00 = (Fad<double> *)operator_new__(uVar4);
  this_00->val_ = dVar2;
  pVVar6 = &this_00->dx_;
  if (dVar2 != 0.0) {
    local_98 = pVVar6;
    do {
      Fad<double>::Fad(in_stack_ffffffffffffff30);
      local_98 = local_98 + 2;
    } while (local_98 != pVVar6 + (long)dVar2 * 2);
  }
  (**(code **)(*in_RDI + 0x188))(in_RDI,pVVar6,in_EDX);
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    Fad<long_double>::Fad<double,_nullptr>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Fad<long_double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    Fad<long_double>::~Fad(in_stack_ffffffffffffff20);
  }
  if (pVVar6 != (Vector<double> *)0x0) {
    dVar2 = this_00->val_;
    pVVar5 = pVVar6 + (long)dVar2 * 2;
    if (pVVar6 != pVVar5) {
      do {
        pVVar5 = pVVar5 + -2;
        Fad<double>::~Fad(this_00);
      } while (pVVar5 != pVVar6);
    }
    operator_delete__(this_00,(long)dVar2 * 0x20 + 8);
  }
  return;
}

Assistant:

void TPZStream::Read(Fad<long double> *p, int howMany) {//weird but necessary for working between different OSs
    Fad<double> *copy = new Fad<double>[howMany];
    Read(copy, howMany);
    for (unsigned int i = 0; i < howMany; ++i) {
        p[i] = (Fad<long double>)copy[i];
    }
    delete[] copy;
}